

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Threads.cpp
# Opt level: O2

ssize_t __thiscall
xmrig::Threads<xmrig::CpuThreads>::read
          (Threads<xmrig::CpuThreads> *this,int __fd,void *__buf,size_t __nbytes)

{
  long lVar1;
  undefined4 in_register_00000034;
  Value *profile;
  Value *value;
  CpuThreads threads;
  CpuThreads CStack_58;
  
  value = (Value *)((*(ulong *)((uint *)CONCAT44(in_register_00000034,__fd) + 2) & 0xffffffffffff) +
                   0x10);
  for (lVar1 = (ulong)*(uint *)CONCAT44(in_register_00000034,__fd) << 5; lVar1 != 0;
      lVar1 = lVar1 + -0x20) {
    if ((ushort)((value->data_).f.flags - 3) < 2) {
      CpuThreads::CpuThreads(&CStack_58,value);
      if (CStack_58.m_data.super__Vector_base<xmrig::CpuThread,_std::allocator<xmrig::CpuThread>_>.
          _M_impl.super__Vector_impl_data._M_start !=
          CStack_58.m_data.super__Vector_base<xmrig::CpuThread,_std::allocator<xmrig::CpuThread>_>.
          _M_impl.super__Vector_impl_data._M_finish) {
        profile = (Value *)((ulong)value[-1].data_.s.str & 0xffffffffffff);
        if ((value[-1].data_.f.flags >> 0xc & 1) != 0) {
          profile = value + -1;
        }
        move(this,(char *)profile,&CStack_58);
      }
      std::_Vector_base<xmrig::CpuThread,_std::allocator<xmrig::CpuThread>_>::~_Vector_base
                (&CStack_58.m_data.
                  super__Vector_base<xmrig::CpuThread,_std::allocator<xmrig::CpuThread>_>);
    }
    value = value + 2;
  }
  return (this->m_profiles)._M_t._M_impl.super__Rb_tree_header._M_node_count;
}

Assistant:

size_t xmrig::Threads<T>::read(const rapidjson::Value &value)
{
    using namespace rapidjson;

    for (auto &member : value.GetObject()) {
        if (member.value.IsArray() || member.value.IsObject()) {
            T threads(member.value);

            if (!threads.isEmpty()) {
                move(member.name.GetString(), std::move(threads));
            }
        }
    }
    for (auto &member : value.GetObject()) {
        if (member.value.IsArray() || member.value.IsObject()) {
            continue;
        }
    }

    return m_profiles.size();
}